

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFArgParser.cc
# Opt level: O0

void __thiscall QPDFArgParser::addHelpFooter(QPDFArgParser *this,string *text)

{
  element_type *peVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  string *local_18;
  string *text_local;
  QPDFArgParser *this_local;
  
  local_18 = text;
  text_local = (string *)this;
  std::operator+(&local_38,"\n",text);
  peVar1 = std::
           __shared_ptr_access<QPDFArgParser::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<QPDFArgParser::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)this);
  std::__cxx11::string::operator=((string *)&peVar1->help_footer,(string *)&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  return;
}

Assistant:

void
QPDFArgParser::addHelpFooter(std::string const& text)
{
    m->help_footer = "\n" + text;
}